

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleartext.c
# Opt level: O2

CURLcode Curl_auth_create_plain_message
                   (Curl_easy *data,char *authzid,char *authcid,char *passwd,char **outptr,
                   size_t *outlen)

{
  ulong uVar1;
  CURLcode CVar2;
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  char *inputbuff;
  size_t insize;
  
  *outlen = 0;
  *outptr = (char *)0x0;
  if (authzid == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(authzid);
  }
  __n_00 = strlen(authcid);
  __n_01 = strlen(passwd);
  uVar1 = __n_00 + __n;
  if (__n_01 < 0x7ffffffffffffffe && uVar1 >> 0x3e == 0) {
    insize = __n_01 + uVar1 + 2;
    inputbuff = (char *)(*Curl_cmalloc)(insize);
    if (inputbuff != (char *)0x0) {
      if (__n != 0) {
        memcpy(inputbuff,authzid,__n);
      }
      inputbuff[__n] = '\0';
      memcpy(inputbuff + __n + 1,authcid,__n_00);
      inputbuff[uVar1 + 1] = '\0';
      memcpy(inputbuff + __n_00 + __n + 2,passwd,__n_01);
      CVar2 = Curl_base64_encode(data,inputbuff,insize,outptr,outlen);
      (*Curl_cfree)(inputbuff);
      return CVar2;
    }
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_auth_create_plain_message(struct Curl_easy *data,
                                        const char *authzid,
                                        const char *authcid,
                                        const char *passwd,
                                        char **outptr, size_t *outlen)
{
  CURLcode result;
  char *plainauth;
  size_t zlen;
  size_t clen;
  size_t plen;
  size_t plainlen;

  *outlen = 0;
  *outptr = NULL;
  zlen = (authzid == NULL ? 0 : strlen(authzid));
  clen = strlen(authcid);
  plen = strlen(passwd);

  /* Compute binary message length. Check for overflows. */
  if(((zlen + clen) > SIZE_T_MAX/4) || (plen > (SIZE_T_MAX/2 - 2)))
    return CURLE_OUT_OF_MEMORY;
  plainlen = zlen + clen + plen + 2;

  plainauth = malloc(plainlen);
  if(!plainauth)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate the reply */
  if(zlen != 0)
    memcpy(plainauth, authzid, zlen);
  plainauth[zlen] = '\0';
  memcpy(plainauth + zlen + 1, authcid, clen);
  plainauth[zlen + clen + 1] = '\0';
  memcpy(plainauth + zlen + clen + 2, passwd, plen);

  /* Base64 encode the reply */
  result = Curl_base64_encode(data, plainauth, plainlen, outptr, outlen);
  free(plainauth);

  return result;
}